

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ScalarReplacementPass::CheckAnnotations
          (ScalarReplacementPass *this,Instruction *varInst)

{
  IRContext *this_00;
  DecorationManager *this_01;
  Instruction *this_02;
  uint32_t uVar1;
  pointer ppIVar2;
  bool bVar3;
  uint uVar4;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_38;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  if ((this_00->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(this_00);
  }
  this_01 = (this_00->decoration_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl
  ;
  uVar1 = 0;
  if (varInst->has_result_id_ == true) {
    uVar1 = Instruction::GetSingleWordOperand(varInst,(uint)varInst->has_type_id_);
  }
  analysis::DecorationManager::GetDecorationsFor(&local_38,this_01,uVar1,false);
  ppIVar2 = local_38.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_38.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_38.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = true;
  }
  else {
    do {
      this_02 = *ppIVar2;
      if (this_02->opcode_ != OpDecorate) {
        __assert_fail("inst->opcode() == spv::Op::OpDecorate",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                      ,0x2c7,
                      "bool spvtools::opt::ScalarReplacementPass::CheckAnnotations(const Instruction *) const"
                     );
      }
      uVar4 = (this_02->has_result_id_ & 1) + 1;
      if (this_02->has_type_id_ == false) {
        uVar4 = (uint)this_02->has_result_id_;
      }
      uVar1 = Instruction::GetSingleWordOperand(this_02,uVar4 + 1);
      if (((0x2e < uVar1) || ((0x7000000c0000U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
         (1 < uVar1 - 0x14eb)) {
        bVar3 = false;
        goto LAB_004f8c90;
      }
      ppIVar2 = ppIVar2 + 1;
    } while (ppIVar2 !=
             local_38.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    bVar3 = true;
  }
LAB_004f8c90:
  if (local_38.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool ScalarReplacementPass::CheckAnnotations(const Instruction* varInst) const {
  for (auto inst :
       get_decoration_mgr()->GetDecorationsFor(varInst->result_id(), false)) {
    assert(inst->opcode() == spv::Op::OpDecorate);
    auto decoration = spv::Decoration(inst->GetSingleWordInOperand(1u));
    switch (decoration) {
      case spv::Decoration::Invariant:
      case spv::Decoration::Restrict:
      case spv::Decoration::Alignment:
      case spv::Decoration::AlignmentId:
      case spv::Decoration::MaxByteOffset:
      case spv::Decoration::AliasedPointer:
      case spv::Decoration::RestrictPointer:
        break;
      default:
        return false;
    }
  }

  return true;
}